

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fGeometryShaderTests.cpp
# Opt level: O1

void __thiscall
deqp::gles31::Functional::anon_unknown_1::OutputCountShader::shadeVertices
          (OutputCountShader *this,VertexAttrib *inputs,VertexPacket **packets,int numPackets)

{
  VertexPacket *pVVar1;
  ulong uVar2;
  Vec4 v;
  Vec4 local_48;
  
  if (0 < numPackets) {
    uVar2 = 0;
    do {
      local_48.m_data[0] = 0.0;
      local_48.m_data[1] = 0.0;
      local_48.m_data[2] = 0.0;
      local_48.m_data[3] = 0.0;
      rr::readVertexAttrib(&local_48,inputs,packets[uVar2]->instanceNdx,packets[uVar2]->vertexNdx);
      pVVar1 = packets[uVar2];
      *(undefined8 *)(pVVar1->position).m_data = local_48.m_data._0_8_;
      *(undefined8 *)((pVVar1->position).m_data + 2) = local_48.m_data._8_8_;
      pVVar1 = packets[uVar2];
      pVVar1->pointSize = 1.0;
      local_48.m_data[0] = 0.0;
      local_48.m_data[1] = 0.0;
      local_48.m_data[2] = 0.0;
      local_48.m_data[3] = 0.0;
      rr::readVertexAttrib(&local_48,inputs + 1,pVVar1->instanceNdx,pVVar1->vertexNdx);
      pVVar1 = packets[uVar2];
      pVVar1->outputs[0].v.uData[0] = (deUint32)local_48.m_data[0];
      pVVar1->outputs[0].v.uData[1] = (deUint32)local_48.m_data[1];
      pVVar1->outputs[0].v.uData[2] = (deUint32)local_48.m_data[2];
      pVVar1->outputs[0].v.uData[3] = (deUint32)local_48.m_data[3];
      uVar2 = uVar2 + 1;
    } while ((uint)numPackets != uVar2);
  }
  return;
}

Assistant:

void OutputCountShader::shadeVertices (const rr::VertexAttrib* inputs, rr::VertexPacket* const* packets, const int numPackets) const
{
	for (int ndx = 0; ndx < numPackets; ++ndx)
	{
		packets[ndx]->position = rr::readVertexAttribFloat(inputs[0], packets[ndx]->instanceNdx, packets[ndx]->vertexNdx);
		packets[ndx]->pointSize = 1.0f;
		packets[ndx]->outputs[0] = rr::readVertexAttribFloat(inputs[1], packets[ndx]->instanceNdx, packets[ndx]->vertexNdx);
	}
}